

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O3

void dec_update_map_for_intra
               (com_scu_t *map_scu,s8 *map_ipm,int tb_x,int tb_y,int tb_w,int tb_h,int i_scu,int ipm
               )

{
  int iVar1;
  s8 *psVar2;
  com_scu_t *pcVar3;
  ulong uVar4;
  
  if (0 < tb_h >> 2) {
    iVar1 = (tb_x >> 2) + (tb_y >> 2) * i_scu;
    pcVar3 = map_scu + iVar1;
    psVar2 = map_ipm + iVar1;
    iVar1 = 0;
    do {
      if (0 < tb_w >> 2) {
        uVar4 = 0;
        do {
          psVar2[uVar4] = (s8)ipm;
          pcVar3[uVar4] = (com_scu_t)0x3;
          uVar4 = uVar4 + 1;
        } while ((uint)(tb_w >> 2) != uVar4);
      }
      psVar2 = psVar2 + i_scu;
      iVar1 = iVar1 + 1;
      pcVar3 = pcVar3 + i_scu;
    } while (iVar1 != tb_h >> 2);
  }
  return;
}

Assistant:

void dec_update_map_for_intra(com_scu_t *map_scu, s8 *map_ipm, int tb_x, int tb_y, int tb_w, int tb_h, int i_scu, int ipm)
{
    int scu_x = tb_x >> MIN_CU_LOG2;
    int scu_y = tb_y >> MIN_CU_LOG2;
    int scu_w = tb_w >> MIN_CU_LOG2;
    int scu_h = tb_h >> MIN_CU_LOG2;
    int scup = scu_y * i_scu + scu_x;
    com_scu_t scu = { 0 };
    scu.coded = 1;
    scu.intra = 1;

    map_ipm += scup;
    map_scu += scup;

    for (int j = 0; j < scu_h; j++) {
        for (int i = 0; i < scu_w; i++) {
            map_ipm[i] = ipm;
            map_scu[i] = scu;
        }
        map_ipm += i_scu;
        map_scu += i_scu;
    }
}